

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

void core::image::save_tiff_file(ConstPtr *image,string *filename)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  invalid_argument *this;
  undefined8 uVar4;
  FileException *this_00;
  ImageBase *pIVar5;
  TypedImageBase<unsigned_char> *pTVar6;
  uchar *puVar7;
  Exception *this_01;
  allocator local_71;
  string local_70 [32];
  long local_50;
  int64_t ret;
  tdata_t buffer;
  int local_38;
  uint32_t channels;
  uint32_t height;
  uint32_t width;
  TIFF *tif;
  string *local_18;
  string *filename_local;
  ConstPtr *image_local;
  
  local_18 = filename;
  filename_local = (string *)image;
  bVar2 = std::operator==(image,(nullptr_t)0x0);
  if (bVar2) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Null image given");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar4 = std::__cxx11::string::c_str();
  _height = TIFFOpen(uVar4,"w");
  if (_height == 0) {
    this_00 = (FileException *)__cxa_allocate_exception(0x48);
    util::FileException::FileException(this_00,local_18,"Unknown TIFF file error");
    __cxa_throw(this_00,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  channels = ImageBase::width(pIVar5);
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  local_38 = ImageBase::height(pIVar5);
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  buffer._4_4_ = ImageBase::channels(pIVar5);
  TIFFSetField(_height,0x100,channels);
  TIFFSetField(_height,0x101,local_38);
  TIFFSetField(_height,0x115,buffer._4_4_);
  TIFFSetField(_height,0x102,8);
  TIFFSetField(_height,0x103,0x80b2);
  TIFFSetField(_height,0x11c,1);
  TIFFSetField(_height,0x106,2);
  pTVar6 = &std::
            __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)image)->super_TypedImageBase<unsigned_char>;
  puVar7 = TypedImageBase<unsigned_char>::get_data_pointer(pTVar6);
  lVar1 = _height;
  ret = (int64_t)puVar7;
  pTVar6 = &std::
            __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)image)->super_TypedImageBase<unsigned_char>;
  iVar3 = TypedImageBase<unsigned_char>::get_value_amount(pTVar6);
  local_50 = TIFFWriteEncodedStrip(lVar1,0,puVar7,(long)iVar3);
  TIFFClose(_height);
  if (local_50 < 0) {
    this_01 = (Exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Error writing TIFF image",&local_71);
    util::Exception::Exception(this_01,(string *)local_70);
    __cxa_throw(this_01,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  return;
}

Assistant:

void
save_tiff_file (ByteImage::ConstPtr image, std::string const& filename)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    TIFF* tif = TIFFOpen(filename.c_str(), "w");
    if (!tif)
        throw util::FileException(filename, "Unknown TIFF file error");

    uint32_t width = image->width();
    uint32_t height = image->height();
    uint32_t channels = image->channels();
    TIFFSetField(tif, TIFFTAG_IMAGEWIDTH, width);
    TIFFSetField(tif, TIFFTAG_IMAGELENGTH, height);
    TIFFSetField(tif, TIFFTAG_SAMPLESPERPIXEL, channels);
    TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, 8);
    TIFFSetField(tif, TIFFTAG_COMPRESSION, COMPRESSION_DEFLATE);
    TIFFSetField(tif, TIFFTAG_PLANARCONFIG, PLANARCONFIG_CONTIG);
    TIFFSetField(tif, TIFFTAG_PHOTOMETRIC, PHOTOMETRIC_RGB);

    tdata_t buffer = const_cast<uint8_t*>(image->get_data_pointer());
    int64_t ret = TIFFWriteEncodedStrip(tif, 0, buffer,
        image->get_value_amount());

    TIFFClose(tif);

    if (ret < 0)
        throw util::Exception("Error writing TIFF image");
}